

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O3

Primer * __thiscall ASDCP::MXF::Primer::WriteToBuffer(Primer *this,FrameBuffer *Buffer)

{
  ui32_t uVar1;
  bool bVar2;
  long in_RDX;
  MemIOWriter MemWRT;
  FrameBuffer LocalTagBuffer;
  MemIOWriter local_c0;
  FrameBuffer local_b0;
  undefined4 local_88 [26];
  
  if (Buffer[5]._vptr_FrameBuffer == (_func_int **)0x0) {
    __assert_fail("m_Dict",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/MXF.cpp"
                  ,0x202,
                  "virtual ASDCP::Result_t ASDCP::MXF::Primer::WriteToBuffer(ASDCP::FrameBuffer &)")
    ;
  }
  FrameBuffer::FrameBuffer(&local_b0);
  local_c0.m_p = (byte_t *)(*(long *)(in_RDX + 8) + 0x14);
  local_c0.m_capacity = *(int *)(in_RDX + 0x10) - 0x14;
  local_c0.m_size = 0;
  if (local_c0.m_capacity != 0) {
    bVar2 = FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::MXF::Primer::LocalTagEntry>_>::
            Archive((FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::MXF::Primer::LocalTagEntry>_>
                     *)&Buffer[3].m_Capacity,&local_c0);
    if (bVar2) {
      Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)&Kumu::RESULT_OK);
    }
    else {
      local_88[0] = 0x205;
      Kumu::Result_t::operator()((int *)this,ASDCP::RESULT_KLV_CODING);
    }
    uVar1 = local_c0.m_size;
    if (-1 < *(int *)&(this->super_KLVFilePacket).super_KLVPacket._vptr_KLVPacket) {
      (*Buffer->_vptr_FrameBuffer[8])(local_88,Buffer);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_88);
      Kumu::Result_t::~Result_t((Result_t *)local_88);
      if (-1 < *(int *)&(this->super_KLVFilePacket).super_KLVPacket._vptr_KLVPacket) {
        *(int *)(in_RDX + 0x18) = *(int *)(in_RDX + 0x18) + uVar1;
      }
    }
    FrameBuffer::~FrameBuffer(&local_b0);
    return this;
  }
  __assert_fail("m_capacity",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/KM_memio.h"
                ,0x38,"Kumu::MemIOWriter::MemIOWriter(byte_t *, ui32_t)");
}

Assistant:

ASDCP::Result_t
ASDCP::MXF::Primer::WriteToBuffer(ASDCP::FrameBuffer& Buffer)
{
  assert(m_Dict);
  ASDCP::FrameBuffer LocalTagBuffer;
  Kumu::MemIOWriter MemWRT(Buffer.Data() + kl_length, Buffer.Capacity() - kl_length);
  Result_t result = LocalTagEntryBatch.Archive(&MemWRT) ? RESULT_OK : RESULT_KLV_CODING(__LINE__, __FILE__);

  if ( ASDCP_SUCCESS(result) )
    {
      ui32_t packet_length = MemWRT.Length();
      result = WriteKLToBuffer(Buffer, packet_length);

      if ( ASDCP_SUCCESS(result) )
	Buffer.Size(Buffer.Size() + packet_length);
    }

  return result;
}